

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall QListModeViewBase::horizontalOffset(QListModeViewBase *this)

{
  Flow FVar1;
  QListViewPrivate *pQVar2;
  long lVar3;
  bool bVar4;
  ScrollMode SVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  QScrollBar *pQVar9;
  ulong uVar10;
  uint uVar11;
  
  SVar5 = QCommonListViewBase::horizontalScrollMode(&this->super_QCommonListViewBase);
  if (SVar5 == ScrollPerItem) {
    pQVar2 = (this->super_QCommonListViewBase).dd;
    FVar1 = pQVar2->flow;
    if (pQVar2->wrap == true) {
      if ((FVar1 == TopToBottom) && (lVar3 = (this->segmentPositions).d.size, lVar3 != 0)) {
        uVar11 = (int)lVar3 - 1;
        pQVar9 = QCommonListViewBase::horizontalScrollBar(&this->super_QCommonListViewBase);
        uVar7 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
        if ((int)uVar11 < (int)uVar7) {
          uVar7 = uVar11;
        }
        uVar10 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar10 = 0;
        }
        iVar6 = (this->segmentPositions).d.ptr[uVar10];
        pQVar9 = QCommonListViewBase::horizontalScrollBar(&this->super_QCommonListViewBase);
        uVar7 = QAbstractSlider::maximum(&pQVar9->super_QAbstractSlider);
        if ((int)uVar7 <= (int)uVar11) {
          uVar11 = uVar7;
        }
        uVar10 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar10 = 0;
        }
        iVar8 = (this->segmentPositions).d.ptr[uVar10];
        bVar4 = QCommonListViewBase::isRightToLeft(&this->super_QCommonListViewBase);
        iVar8 = iVar8 - iVar6;
        if (!bVar4) {
          iVar8 = iVar6;
        }
        return iVar8;
      }
    }
    else if ((FVar1 == LeftToRight) && ((this->flowPositions).d.size != 0)) {
      pQVar9 = QCommonListViewBase::horizontalScrollBar(&this->super_QCommonListViewBase);
      iVar6 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
      iVar6 = (this->flowPositions).d.ptr[(this->scrollValueMap).d.ptr[iVar6]];
      pQVar9 = QCommonListViewBase::horizontalScrollBar(&this->super_QCommonListViewBase);
      iVar8 = QAbstractSlider::maximum(&pQVar9->super_QAbstractSlider);
      iVar8 = (this->flowPositions).d.ptr[(this->scrollValueMap).d.ptr[iVar8]];
      bVar4 = QCommonListViewBase::isRightToLeft(&this->super_QCommonListViewBase);
      if (bVar4) {
        return iVar8 - iVar6;
      }
      return iVar6;
    }
  }
  iVar6 = QCommonListViewBase::horizontalOffset(&this->super_QCommonListViewBase);
  return iVar6;
}

Assistant:

int QListModeViewBase::horizontalOffset() const
{
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
        if (isWrapping()) {
            if (flow() == QListView::TopToBottom && !segmentPositions.isEmpty()) {
                const int max = segmentPositions.size() - 1;
                int currentValue = qBound(0, horizontalScrollBar()->value(), max);
                int position = segmentPositions.at(currentValue);
                int maximumValue = qBound(0, horizontalScrollBar()->maximum(), max);
                int maximum = segmentPositions.at(maximumValue);
                return (isRightToLeft() ? maximum - position : position);
            }
        } else if (flow() == QListView::LeftToRight && !flowPositions.isEmpty()) {
            int position = flowPositions.at(scrollValueMap.at(horizontalScrollBar()->value()));
            int maximum = flowPositions.at(scrollValueMap.at(horizontalScrollBar()->maximum()));
            return (isRightToLeft() ? maximum - position : position);
        }
    }
    return QCommonListViewBase::horizontalOffset();
}